

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O2

bool __thiscall
crnlib::crn_comp::pack_color_endpoints
          (crn_comp *this,vector<unsigned_char> *packed_data,vector<unsigned_short> *remapping)

{
  uint uVar1;
  uint *puVar2;
  unsigned_short *puVar3;
  undefined1 uVar4;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 aVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  color_quad_u8 *pcVar14;
  undefined4 *puVar15;
  uint k;
  long lVar16;
  color_quad_u8 *pcVar17;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *this_00;
  color_quad_u8 prev [2];
  vector<unsigned_int> residual_syms;
  vector<unsigned_int> remapped_endpoints;
  symbol_histogram hist [2];
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_138 [14];
  static_huffman_data_model local_100;
  color_quad_u8 cur [2];
  uchar *local_80;
  uint local_78;
  uint uStack_74;
  
  vector<unsigned_int>::vector(&remapped_endpoints,(this->m_color_endpoints).m_size);
  puVar2 = (this->m_color_endpoints).m_p;
  puVar3 = remapping->m_p;
  for (uVar13 = 0; uVar13 < (this->m_color_endpoints).m_size; uVar13 = uVar13 + 1) {
    remapped_endpoints.m_p[puVar3[uVar13]] = puVar2[uVar13];
  }
  vector<unsigned_int>::vector(&hist[0].m_hist,0);
  vector<unsigned_int>::vector(&hist[1].m_hist,0);
  symbol_histogram::resize(hist,0x20);
  symbol_histogram::resize((symbol_histogram *)&hist[1].m_hist,0x40);
  residual_syms.m_p = (uint *)0x0;
  residual_syms.m_size = 0;
  residual_syms.m_capacity = 0;
  vector<unsigned_int>::reserve(&residual_syms,(this->m_color_endpoints).m_size * 6);
  prev[0].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
  prev[1].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)0x0;
  for (uVar13 = 0; uVar13 < (this->m_color_endpoints).m_size; uVar13 = uVar13 + 1) {
    uVar1 = remapped_endpoints.m_p[uVar13];
    dxt1_block::unpack_color((dxt1_block *)&local_138[0].field_0,(uint16)uVar1,false,0xff);
    aVar5 = local_138[0];
    cur[0].field_0.field_0.r = local_138[0].field_0.r;
    cur[0].field_0.field_0.g = local_138[0].field_0.g;
    cur[0].field_0.field_0.b = local_138[0].field_0.b;
    cur[0].field_0.field_0.a = local_138[0].field_0.a;
    dxt1_block::unpack_color((dxt1_block *)&local_138[0].field_0,(uint16)(uVar1 >> 0x10),false,0xff)
    ;
    uVar4 = local_138[0].field_0.r;
    uVar6 = local_138[0].field_0.g;
    cur[1].field_0.field_0.r = local_138[0].field_0.r;
    cur[1].field_0.field_0.g = local_138[0].field_0.g;
    uVar7 = local_138[0].field_0.b;
    cur[1].field_0.field_0.b = local_138[0].field_0.b;
    uVar8 = local_138[0].field_0.a;
    cur[1].field_0.field_0.a = local_138[0].field_0.a;
    puVar15 = &DAT_0018ce00;
    pcVar17 = prev;
    pcVar14 = cur;
    for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
      for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
        local_138[0].m_u32 =
             (uint)(pcVar14->field_0).c[lVar16] - (uint)(pcVar17->field_0).c[lVar16] &
             puVar15[lVar16];
        puVar2 = hist[lVar16 == 1].m_hist.m_p + local_138[0].m_u32;
        *puVar2 = *puVar2 + 1;
        vector<unsigned_int>::push_back(&residual_syms,(uint *)local_138[0].c);
      }
      pcVar14 = pcVar14 + 1;
      pcVar17 = pcVar17 + 1;
      puVar15 = puVar15 + 3;
    }
    prev[1].field_0.field_0.r = uVar4;
    prev[0].field_0 =
         (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
         (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)aVar5.m_u32;
    prev[1].field_0.field_0.g = uVar6;
    prev[1].field_0.field_0.b = uVar7;
    prev[1].field_0.field_0.a = uVar8;
  }
  this_00 = local_138;
  static_huffman_data_model::static_huffman_data_model
            ((static_huffman_data_model *)&this_00->field_0);
  static_huffman_data_model::static_huffman_data_model(&local_100);
  symbol_codec::symbol_codec((symbol_codec *)cur);
  symbol_codec::start_encoding((symbol_codec *)cur,0x100000);
  uVar13 = 0;
  while (uVar12 = uVar13, uVar12 != 2) {
    iVar9 = static_huffman_data_model::init
                      ((static_huffman_data_model *)&this_00->field_0,(EVP_PKEY_CTX *)0x1);
    if ((char)iVar9 == '\0') goto LAB_001509af;
    uVar10 = symbol_codec::encode_transmit_static_huffman_data_model
                       ((symbol_codec *)cur,(static_huffman_data_model *)&this_00->field_0,false,
                        (static_huffman_data_model *)0x0);
    this_00 = this_00 + 0xe;
    uVar13 = uVar12 + 1;
    if (uVar10 == 0) goto LAB_001509af;
  }
  uVar13 = 0;
  while( true ) {
    if ((residual_syms._8_8_ & 0xffffffff) <= uVar13) break;
    symbol_codec::encode
              ((symbol_codec *)cur,residual_syms.m_p[uVar13],
               (static_huffman_data_model *)
               &local_138[(ulong)((int)((uVar13 & 0xffffffff) / 3) * 3 + 1 == (int)uVar13) * 0xe].
                field_0);
    uVar13 = uVar13 + 1;
  }
  symbol_codec::stop_encoding((symbol_codec *)cur,false);
  packed_data->m_p = local_80;
  packed_data->m_size = local_78;
  packed_data->m_capacity = uStack_74;
LAB_001509af:
  symbol_codec::~symbol_codec((symbol_codec *)cur);
  lVar11 = 0x38;
  do {
    static_huffman_data_model::~static_huffman_data_model
              ((static_huffman_data_model *)((long)local_138 + lVar11));
    lVar11 = lVar11 + -0x38;
  } while (lVar11 != -0x38);
  vector<unsigned_int>::~vector(&residual_syms);
  lVar11 = 0x10;
  do {
    vector<unsigned_int>::~vector((vector<unsigned_int> *)((long)&hist[0].m_hist.m_p + lVar11));
    lVar11 = lVar11 + -0x10;
  } while (lVar11 != -0x10);
  vector<unsigned_int>::~vector(&remapped_endpoints);
  return 1 < uVar12;
}

Assistant:

bool crn_comp::pack_color_endpoints(crnlib::vector<uint8>& packed_data, const crnlib::vector<uint16>& remapping)
    {
        crnlib::vector<uint> remapped_endpoints(m_color_endpoints.size());

        for (uint i = 0; i < m_color_endpoints.size(); i++)
        {
            remapped_endpoints[remapping[i]] = m_color_endpoints[i];
        }

        const uint component_limits[6] = { 31, 63, 31, 31, 63, 31 };

        symbol_histogram hist[2];
        hist[0].resize(32);
        hist[1].resize(64);

        crnlib::vector<uint> residual_syms;
        residual_syms.reserve(m_color_endpoints.size() * 2 * 3);

        color_quad_u8 prev[2];
        prev[0].clear();
        prev[1].clear();

        int total_residuals = 0;

        for (uint endpoint_index = 0; endpoint_index < m_color_endpoints.size(); endpoint_index++)
        {
            const uint endpoint = remapped_endpoints[endpoint_index];

            color_quad_u8 cur[2];
            cur[0] = dxt1_block::unpack_color((uint16)(endpoint & 0xFFFF), false);
            cur[1] = dxt1_block::unpack_color((uint16)((endpoint >> 16) & 0xFFFF), false);

            for (uint j = 0; j < 2; j++)
            {
                for (uint k = 0; k < 3; k++)
                {
                    int delta = cur[j][k] - prev[j][k];
                    total_residuals += delta * delta;
                    int sym = delta & component_limits[j * 3 + k];
                    int table = (k == 1) ? 1 : 0;
                    hist[table].inc_freq(sym);
                    residual_syms.push_back(sym);
                }
            }

            prev[0] = cur[0];
            prev[1] = cur[1];
        }

        static_huffman_data_model residual_dm[2];

        symbol_codec codec;
        codec.start_encoding(1024 * 1024);

        // Transmit residuals
        for (uint i = 0; i < 2; i++)
        {
            if (!residual_dm[i].init(true, hist[i], 15))
            {
                return false;
            }

            if (!codec.encode_transmit_static_huffman_data_model(residual_dm[i], false))
            {
                return false;
            }
        }

        for (uint i = 0; i < residual_syms.size(); i++)
        {
            const uint sym = residual_syms[i];
            const uint table = ((i % 3) == 1) ? 1 : 0;
            codec.encode(sym, residual_dm[table]);
        }

        codec.stop_encoding(false);

        packed_data.swap(codec.get_encoding_buf());

        return true;
    }